

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlmodule.c
# Opt level: O0

xmlModulePtr xmlModuleOpen(char *name,int options)

{
  void *pvVar1;
  xmlChar *pxVar2;
  xmlModulePtr module;
  int options_local;
  char *name_local;
  
  name_local = (char *)(*xmlMalloc)(0x10);
  if (name_local == (char *)0x0) {
    name_local = (char *)0x0;
  }
  else {
    memset(name_local,0,0x10);
    pvVar1 = xmlModulePlatformOpen(name);
    *(void **)(name_local + 8) = pvVar1;
    if (*(long *)(name_local + 8) == 0) {
      (*xmlFree)(name_local);
      name_local = (char *)0x0;
    }
    else {
      pxVar2 = xmlStrdup((xmlChar *)name);
      *(xmlChar **)name_local = pxVar2;
    }
  }
  return (xmlModulePtr)name_local;
}

Assistant:

xmlModulePtr
xmlModuleOpen(const char *name, int options ATTRIBUTE_UNUSED)
{
    xmlModulePtr module;

    module = (xmlModulePtr) xmlMalloc(sizeof(xmlModule));
    if (module == NULL)
        return (NULL);

    memset(module, 0, sizeof(xmlModule));

    module->handle = xmlModulePlatformOpen(name);

    if (module->handle == NULL) {
        xmlFree(module);
        return(NULL);
    }

    module->name = xmlStrdup((const xmlChar *) name);
    return (module);
}